

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m128i _in1_1;
  undefined1 auVar8 [16];
  __m128i _in1;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  alVar4 = *input;
  alVar1 = input[1];
  auVar5._0_12_ = alVar4._0_12_;
  auVar5._12_2_ = alVar4[0]._6_2_;
  auVar5._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar19._12_4_ = auVar5._12_4_;
  auVar19._0_10_ = alVar4._0_10_;
  auVar19._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar2._10_6_ = auVar19._10_6_;
  auVar2._0_8_ = alVar4[0];
  auVar2._8_2_ = alVar4[0]._4_2_;
  auVar10._8_8_ = auVar2._8_8_;
  auVar10._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar10._4_2_ = alVar4[0]._2_2_;
  auVar10._0_2_ = (undefined2)alVar4[0];
  auVar10._2_2_ = (short)input[2][0];
  auVar9._2_2_ = (short)input[2][1];
  auVar9._0_2_ = (short)alVar4[1];
  auVar9._4_2_ = alVar4[1]._2_2_;
  auVar9._6_2_ = *(undefined2 *)((long)input[2] + 10);
  auVar9._8_2_ = alVar4[1]._4_2_;
  auVar9._10_2_ = *(undefined2 *)((long)input[2] + 0xc);
  auVar9._12_2_ = alVar4[1]._6_2_;
  auVar9._14_2_ = *(undefined2 *)((long)input[2] + 0xe);
  auVar18._8_4_ = 0xb500b50;
  auVar18._0_8_ = 0xb500b500b500b50;
  auVar18._12_4_ = 0xb500b50;
  auVar5 = pmaddwd(auVar10,auVar18);
  auVar19 = pmaddwd(auVar18,auVar9);
  auVar7._8_4_ = 0xf4b00b50;
  auVar7._0_8_ = 0xf4b00b50f4b00b50;
  auVar7._12_4_ = 0xf4b00b50;
  auVar2 = pmaddwd(auVar10,auVar7);
  auVar10 = pmaddwd(auVar9,auVar7);
  auVar6._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar20._0_4_ = auVar19._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar19._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar19._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar19._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar6,auVar20);
  auVar16._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar2 = packssdw(auVar16,auVar11);
  auVar15._0_12_ = alVar1._0_12_;
  auVar15._12_2_ = alVar1[0]._6_2_;
  auVar15._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar14._12_4_ = auVar15._12_4_;
  auVar14._0_10_ = alVar1._0_10_;
  auVar14._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar13._10_6_ = auVar14._10_6_;
  auVar13._0_8_ = alVar1[0];
  auVar13._8_2_ = alVar1[0]._4_2_;
  auVar12._8_8_ = auVar13._8_8_;
  auVar12._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar12._4_2_ = alVar1[0]._2_2_;
  auVar12._0_2_ = (undefined2)alVar1[0];
  auVar12._2_2_ = (short)input[3][0];
  auVar3._2_2_ = (short)input[3][1];
  auVar3._0_2_ = (short)alVar1[1];
  auVar3._4_2_ = alVar1[1]._2_2_;
  auVar3._6_2_ = *(undefined2 *)((long)input[3] + 10);
  auVar3._8_2_ = alVar1[1]._4_2_;
  auVar3._10_2_ = *(undefined2 *)((long)input[3] + 0xc);
  auVar3._12_2_ = alVar1[1]._6_2_;
  auVar3._14_2_ = *(undefined2 *)((long)input[3] + 0xe);
  auVar21._8_4_ = 0xf138061f;
  auVar21._0_8_ = 0xf138061ff138061f;
  auVar21._12_4_ = 0xf138061f;
  auVar19 = pmaddwd(auVar12,auVar21);
  auVar22 = pmaddwd(auVar21,auVar3);
  auVar24._8_4_ = 0x61f0ec8;
  auVar24._0_8_ = 0x61f0ec8061f0ec8;
  auVar24._12_4_ = 0x61f0ec8;
  auVar16 = pmaddwd(auVar12,auVar24);
  auVar10 = pmaddwd(auVar3,auVar24);
  auVar8._0_4_ = auVar19._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar19._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar19._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar19._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar19 = packssdw(auVar8,auVar23);
  auVar17._0_4_ = auVar16._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar16._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar16._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar16._12_4_ + 0x800 >> 0xc;
  auVar22._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar10 = packssdw(auVar17,auVar22);
  alVar4 = (__m128i)paddsw(auVar5,auVar10);
  *output = alVar4;
  alVar4 = (__m128i)psubsw(auVar5,auVar10);
  output[3] = alVar4;
  alVar4 = (__m128i)paddsw(auVar2,auVar19);
  output[1] = alVar4;
  alVar4 = (__m128i)psubsw(auVar2,auVar19);
  output[2] = alVar4;
  return;
}

Assistant:

static void idct4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);

  // stage 1
  __m128i x[4];
  x[0] = input[0];
  x[1] = input[2];
  x[2] = input[1];
  x[3] = input[3];

  // stage 2
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);

  // stage 3
  btf_16_adds_subs_out_sse2(output[0], output[3], x[0], x[3]);
  btf_16_adds_subs_out_sse2(output[1], output[2], x[1], x[2]);
}